

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall chatra::Thread::processSwitchCase(Thread *this,bool enter)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  element_type *peVar5;
  const_iterator __first;
  const_iterator cVar6;
  const_iterator cVar7;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  __last;
  size_t sVar8;
  bool bVar9;
  value_type *nextNode;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_40;
  reference local_38;
  Frame *f1;
  __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
  local_28;
  reference local_20;
  Frame *f0;
  Thread *pTStack_10;
  bool enter_local;
  Thread *this_local;
  
  f0._7_1_ = enter;
  pTStack_10 = this;
  if (enter) {
    f1 = (Frame *)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::end(&this->frames);
    local_28 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-((__normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
                            *)&f1,1);
    local_20 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator*(&local_28);
    nextNode = (value_type *)
               std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::end(&this->frames);
    local_40 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator-((__normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
                            *)&nextNode,2);
    local_38 = __gnu_cxx::
               __normal_iterator<chatra::Frame_*,_std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>_>
               ::operator*(&local_40);
    while( true ) {
      bVar2 = std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::empty(&local_20->node->blockNodes);
      bVar9 = false;
      if (bVar2) {
        uVar1 = local_38->phase;
        sVar3 = std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::size(&local_38->node->blockNodes);
        bVar9 = uVar1 < sVar3;
      }
      if (!bVar9) break;
      this_00 = &std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::operator[](&local_38->node->blockNodes,local_38->phase)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
      peVar4 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      checkIsValidNode(this,peVar4);
      peVar5 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      if ((peVar5->type != Case) &&
         (peVar5 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_00), peVar5->type != Default)) break;
      peVar4 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      local_20->node = peVar4;
      local_38->phase = local_38->phase + 1;
    }
    local_20->phase = 0;
    __first = std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::cbegin(&local_38->node->blockNodes);
    cVar6 = std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            cbegin(&local_38->node->blockNodes);
    cVar7 = std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            cend(&local_38->node->blockNodes);
    __last = std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,chatra::Thread::processSwitchCase(bool)::__0>
                       (cVar6._M_current,cVar7._M_current);
    sVar8 = std::
            distance<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                      ((__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                        )__first._M_current,__last);
    local_38->phase = sVar8;
  }
  else {
    pop(this);
  }
  return;
}

Assistant:

void Thread::processSwitchCase(bool enter) {
	if (!enter) {
		pop();
		return;
	}

	auto& f0 = *(frames.end() - 1);
	auto& f1 = *(frames.end() - 2);

	while (f0.node->blockNodes.empty() && f1.phase < f1.node->blockNodes.size()) {
		auto& nextNode = f1.node->blockNodes[f1.phase];
		checkIsValidNode(nextNode.get());
		if (nextNode->type != NodeType::Case && nextNode->type != NodeType::Default)
			break;
		f0.node = nextNode.get();
		f1.phase++;
	}

	f0.phase = 0;
	f1.phase = static_cast<size_t>(std::distance(f1.node->blockNodes.cbegin(),
			std::find_if(f1.node->blockNodes.cbegin(), f1.node->blockNodes.cend(), [](const std::shared_ptr<Node>& n) {
				return n->type == NodeType::Catch || n->type == NodeType::Finally;
			})));
}